

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

bool __thiscall CMU462::StaticScene::Sphere::intersect(Sphere *this,Ray *ray,Intersection *isect)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  double t2;
  double t1;
  double local_58;
  double local_50;
  Vector3D local_48;
  Vector3D local_30;
  
  bVar2 = test(this,ray,&local_50,&local_58);
  if (bVar2) {
    dVar1 = (double)(~-(ulong)(local_50 < 0.0) & (ulong)local_50 |
                    (ulong)local_58 & -(ulong)(local_50 < 0.0));
    bVar2 = false;
    if ((dVar1 <= ray->max_t) && (bVar2 = false, ray->min_t <= dVar1)) {
      ray->max_t = dVar1;
      isect->t = dVar1;
      local_48.z = (ray->d).z * dVar1 + (ray->o).z;
      local_48.x = dVar1 * (ray->d).x + (ray->o).x;
      local_48.y = dVar1 * (ray->d).y + (ray->o).y;
      normal(&local_30,this,&local_48);
      (isect->n).z = local_30.z;
      (isect->n).x = local_30.x;
      (isect->n).y = local_30.y;
      iVar3 = (*(this->super_Primitive)._vptr_Primitive[3])(this);
      isect->bsdf = (BSDF *)CONCAT44(extraout_var,iVar3);
      isect->primitive = &this->super_Primitive;
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Sphere::intersect(const Ray& ray, Intersection* isect) const {
		// TODO (PathTracer):
		// Implement ray - sphere intersection.
		// Note again that you might want to use the the Sphere::test helper here.
		// When an intersection takes place, the Intersection data should be updated
		// correspondingly.
		double t1, t2, first_hit;
		bool result = test(ray, t1, t2);

		// take into consideration when the origin of the
		// ray is inside the sphere
		if (t1 < 0) first_hit = t2;
		else first_hit = t1;

		if (result && first_hit <= ray.max_t && first_hit >= ray.min_t) {
			ray.max_t = first_hit;

			isect->t = first_hit;
			isect->n = normal(ray.o+ray.d*first_hit);
			isect->bsdf = get_bsdf();
			isect->primitive = this;

			return true;
		}
		else return false;
	}